

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void movnti_(PDISASM pMyDisasm)

{
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
    return;
  }
  (pMyDisasm->Instruction).Category = 0x50019;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movnti",7);
  EvGv(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ movnti_(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   failDecode(pMyDisasm);
   return;
 }
 pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
 #ifndef BEA_LIGHT_DISASSEMBLY
    (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movnti");
 #endif
 EvGv(pMyDisasm);

}